

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O1

void __thiscall CItems::RenderLaser(CItems *this,CNetObj_Laser *pCurrent)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  CGameClient *pCVar5;
  CNetObj_GameData *pCVar6;
  IGraphics *pIVar7;
  long in_FS_OFFSET;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar16;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 local_78;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  long local_18;
  undefined1 auVar14 [16];
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = pCurrent->m_X;
  uVar3 = pCurrent->m_Y;
  fVar12 = (float)(int)uVar1;
  fVar16 = (float)(int)uVar3;
  uVar2 = pCurrent->m_FromX;
  uVar4 = pCurrent->m_FromY;
  fVar8 = (float)(int)uVar2;
  fVar11 = (float)(int)uVar4;
  fVar17 = fVar12 - fVar8;
  fVar19 = fVar16 - fVar11;
  local_78 = CONCAT44(fVar19,fVar19);
  fVar9 = fVar17 * fVar17 + fVar19 * fVar19;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  if (RenderLaser(CNetObj_Laser_const*)::s_LastGameTick == '\0') {
    RenderLaser(this);
  }
  if (RenderLaser(CNetObj_Laser_const*)::s_LastIntraTick == '\0') {
    RenderLaser(this);
  }
  pCVar5 = (this->super_CComponent).m_pClient;
  pCVar6 = (pCVar5->m_Snap).m_pGameData;
  if ((pCVar6 == (CNetObj_GameData *)0x0) || ((pCVar6->m_GameStateFlags & 0x1c) == 0)) {
    RenderLaser::s_LastGameTick = pCVar5->m_pClient->m_CurGameTick;
    RenderLaser::s_LastIntraTick = pCVar5->m_pClient->m_GameIntraTick;
  }
  fVar18 = ((((float)(pCVar5->m_pClient->m_CurGameTick - pCurrent->m_StartTick) +
             RenderLaser::s_LastIntraTick) * 1000.0) / (float)pCVar5->m_pClient->m_GameTickSpeed) /
           ((float)(pCVar5->m_Tuning).m_LaserBounceDelay.m_Value / 100.0);
  fVar10 = 1.0;
  if (fVar18 <= 1.0) {
    fVar10 = fVar18;
  }
  fVar10 = (float)(-(uint)(fVar18 < 0.0) & 0x3f800000 |
                  ~-(uint)(fVar18 < 0.0) & (uint)(1.0 - fVar10));
  (*(pCVar5->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x13])(pIVar7,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  fVar18 = fVar10 * 7.0;
  auVar14._8_4_ = fVar19;
  auVar14._0_8_ = local_78;
  auVar14._12_4_ = -fVar19;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._0_8_ = CONCAT44(fVar17,fVar19) ^ 0x8000000000000000;
  auVar15._4_4_ = fVar9;
  auVar15._0_4_ = fVar9;
  auVar15._8_4_ = fVar9;
  auVar15._12_4_ = fVar9;
  auVar15 = divps(auVar13,auVar15);
  fVar9 = fVar18 * auVar15._0_4_;
  fVar18 = fVar18 * auVar15._4_4_;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_38 = CONCAT44(fVar11 - fVar18,fVar8 - fVar9);
  uStack_30 = CONCAT44(fVar18 + fVar11,fVar9 + fVar8);
  local_28 = fVar12 - fVar9;
  fStack_24 = fVar16 - fVar18;
  fStack_20 = fVar9 + fVar12;
  fStack_1c = fVar18 + fVar16;
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1e])(pIVar7,&local_38,1);
  fVar10 = fVar10 * 5.0;
  fVar9 = fVar10 * auVar15._0_4_;
  fVar10 = fVar10 * auVar15._4_4_;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_38 = CONCAT44(fVar11 - fVar10,fVar8 - fVar9);
  uStack_30 = CONCAT44(fVar10 + fVar11,fVar9 + fVar8);
  local_28 = fVar12 - fVar9;
  fStack_24 = fVar16 - fVar10;
  fStack_20 = fVar9 + fVar12;
  fStack_1c = fVar10 + fVar16;
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1e])(pIVar7,&local_38,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x13])
            (pIVar7,(ulong)(uint)g_pData->m_aImages[3].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  CRenderTools::SelectSprite
            (&((this->super_CComponent).m_pClient)->m_RenderTools,
             *(int *)(&DAT_001dbf50 + (long)(RenderLaser::s_LastGameTick % 3) * 4),0,0,0);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])
            ((float)RenderLaser::s_LastGameTick);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  uStack_40 = 0x41c00000;
  uStack_3c = 0x41c00000;
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_48 = fVar12;
  fStack_44 = fVar16;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1c])(pIVar7,&local_48,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  uStack_40 = 0x41a00000;
  uStack_3c = 0x41a00000;
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_48 = fVar12;
  fStack_44 = fVar16;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1c])(pIVar7,&local_48,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CItems::RenderLaser(const struct CNetObj_Laser *pCurrent)
{
	const vec2 Pos = vec2(pCurrent->m_X, pCurrent->m_Y);
	const vec2 From = vec2(pCurrent->m_FromX, pCurrent->m_FromY);
	const vec2 Dir = normalize(Pos-From);

	static int s_LastGameTick = Client()->GameTick();
	static float s_LastIntraTick = Client()->IntraGameTick();
	if(!m_pClient->IsWorldPaused())
	{
		s_LastGameTick = Client()->GameTick();
		s_LastIntraTick = Client()->IntraGameTick();
	}

	// This is not using s_LastGameTick because m_StartTick is synchronized by the server
	const float LifetimeMillis = 1000.0f * (Client()->GameTick() - pCurrent->m_StartTick + s_LastIntraTick) / Client()->GameTickSpeed();
	const float RemainingRelativeLifetime = 1.0f - clamp(LifetimeMillis / m_pClient->m_Tuning.m_LaserBounceDelay, 0.0f, 1.0f);

	Graphics()->BlendNormal();
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();

	// do outline
	const vec4 OuterColor(0.075f, 0.075f, 0.25f, 1.0f);
	const vec2 Outer = vec2(Dir.y, -Dir.x) * (7.0f*RemainingRelativeLifetime);
	Graphics()->SetColor(OuterColor);
	IGraphics::CFreeformItem Freeform(
			From.x-Outer.x, From.y-Outer.y,
			From.x+Outer.x, From.y+Outer.y,
			Pos.x-Outer.x, Pos.y-Outer.y,
			Pos.x+Outer.x, Pos.y+Outer.y);
	Graphics()->QuadsDrawFreeform(&Freeform, 1);

	// do inner
	const vec4 InnerColor(0.5f, 0.5f, 1.0f, 1.0f);
	const vec2 Inner = vec2(Dir.y, -Dir.x) * (5.0f*RemainingRelativeLifetime);
	Graphics()->SetColor(InnerColor);
	Freeform = IGraphics::CFreeformItem(
			From.x-Inner.x, From.y-Inner.y,
			From.x+Inner.x, From.y+Inner.y,
			Pos.x-Inner.x, Pos.y-Inner.y,
			Pos.x+Inner.x, Pos.y+Inner.y);
	Graphics()->QuadsDrawFreeform(&Freeform, 1);

	Graphics()->QuadsEnd();

	// render head
	Graphics()->BlendNormal();
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_PARTICLES].m_Id);
	Graphics()->QuadsBegin();

	const int aSprites[] = { SPRITE_PART_SPLAT01, SPRITE_PART_SPLAT02, SPRITE_PART_SPLAT03 };
	RenderTools()->SelectSprite(aSprites[s_LastGameTick%3]);
	Graphics()->QuadsSetRotation(s_LastGameTick);
	Graphics()->SetColor(OuterColor);
	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y, 24, 24);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->SetColor(InnerColor);
	QuadItem = IGraphics::CQuadItem(Pos.x, Pos.y, 20, 20);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsEnd();

	Graphics()->BlendNormal();
}